

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::Compiler::find_function_local_luts
          (Compiler *this,SPIRFunction *entry,AnalyzeVariableScopeAccessHandler *handler,
          bool single_function)

{
  uint32_t uVar1;
  iterator iVar2;
  SPIRVariable *pSVar3;
  SPIRType *pSVar4;
  const_iterator cVar5;
  ulong uVar6;
  SPIRConstant *pSVar7;
  const_iterator cVar8;
  SPIRBlock *block;
  Variant *pVVar9;
  uint uVar10;
  _Hash_node_base *p_Var11;
  _Hash_node_base *p_Var12;
  char cVar13;
  uint32_t dominator;
  StaticExpressionAccessHandler static_expression_handler;
  DominatorBuilder builder;
  uint local_84;
  OpcodeHandler local_80;
  Compiler *local_78;
  uint32_t local_70;
  undefined8 local_6c;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_60;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_58;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
  local_50;
  CFG *local_48;
  DominatorBuilder local_40;
  
  local_80._vptr_OpcodeHandler._0_4_ = (entry->super_IVariant).self.id;
  iVar2 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->function_cfgs)._M_h,(key_type *)&local_80);
  p_Var12 = (handler->accessed_variables_to_block)._M_h._M_before_begin._M_nxt;
  if (p_Var12 != (_Hash_node_base *)0x0) {
    local_48 = *(CFG **)((long)iVar2.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_false>
                               ._M_cur + 0x10);
    local_58 = &(handler->complete_write_variables_to_block)._M_h;
    local_60 = &(handler->partial_write_variables_to_block)._M_h;
    do {
      pSVar3 = Variant::get<diligent_spirv_cross::SPIRVariable>
                         ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                          *(uint *)&p_Var12[1]._M_nxt);
      uVar1 = expression_type_id(this,*(uint32_t *)&p_Var12[1]._M_nxt);
      pSVar4 = Variant::get<diligent_spirv_cross::SPIRType>
                         ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + uVar1
                         );
      cVar13 = pSVar3->is_written_to;
      if ((bool)cVar13 == false) {
        local_80._vptr_OpcodeHandler._0_4_ = (pSVar3->super_IVariant).self.id;
        cVar5 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(local_58,(key_type *)&local_80);
        cVar13 = true;
        if (cVar5.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          local_40.cfg._0_4_ = (pSVar3->super_IVariant).self.id;
          cVar5 = ::std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(local_60,(key_type *)&local_40);
          cVar13 = cVar5.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                   ._M_cur != (__node_type *)0x0;
        }
        pSVar3->is_written_to = (bool)cVar13;
      }
      if (((pSVar3->storage == Function || pSVar3->storage == Private && single_function) &&
          (pSVar3->phi_variable == false)) &&
         ((pSVar4->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
        uVar10 = (pSVar3->initializer).id;
        uVar6 = (ulong)uVar10;
        if (uVar6 == 0) {
          local_80._vptr_OpcodeHandler._0_4_ = (pSVar3->super_IVariant).self.id;
          cVar5 = ::std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(local_60,(key_type *)&local_80);
          if (cVar5.
              super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            local_80._vptr_OpcodeHandler._0_4_ = (pSVar3->super_IVariant).self.id;
            cVar5 = ::std::
                    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(local_58,(key_type *)&local_80);
            if ((cVar5.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                 ._M_cur != (__node_type *)0x0) &&
               (*(long *)((long)cVar5.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                                ._M_cur + 0x28) == 1)) {
              local_50 = cVar5.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                         ._M_cur;
              DominatorBuilder::DominatorBuilder(&local_40,local_48);
              for (p_Var11 = p_Var12[4]._M_nxt; p_Var11 != (_Hash_node_base *)0x0;
                  p_Var11 = p_Var11->_M_nxt) {
                DominatorBuilder::add_block(&local_40,*(uint32_t *)&p_Var11[1]._M_nxt);
              }
              local_84 = local_40.dominator;
              cVar8 = ::std::
                      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)((long)&((local_50._M_cur)->
                                        super__Hash_node_value<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                                        ._M_storage._M_storage + 8),&local_84);
              if (cVar8.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
              {
                local_70 = (pSVar3->super_IVariant).self.id;
                local_80._vptr_OpcodeHandler._0_4_ = 0x922430;
                local_80._vptr_OpcodeHandler._4_4_ = 0;
                local_6c = 0;
                local_78 = this;
                block = Variant::get<diligent_spirv_cross::SPIRBlock>
                                  ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                                   ptr + local_84);
                traverse_all_reachable_opcodes(this,block,&local_80);
                if ((uint)local_6c != 0 && local_6c._4_4_ == 1) {
                  uVar6 = local_6c & 0xffffffff;
                  pVVar9 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr;
                  uVar10 = (uint)local_6c;
                  if (pVVar9[uVar6].type == TypeConstant) goto LAB_0032e537;
                }
              }
            }
          }
        }
        else {
          pVVar9 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr;
          if ((pVVar9[uVar6].type == TypeConstant) && (cVar13 == '\0')) {
LAB_0032e537:
            pSVar7 = Variant::get<diligent_spirv_cross::SPIRConstant>(pVVar9 + uVar6);
            pSVar7->is_used_as_lut = true;
            (pSVar3->static_expression).id = uVar10;
            pSVar3->statically_assigned = true;
            pSVar3->remapped_variable = true;
          }
        }
      }
      p_Var12 = p_Var12->_M_nxt;
    } while (p_Var12 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void Compiler::find_function_local_luts(SPIRFunction &entry, const AnalyzeVariableScopeAccessHandler &handler,
                                        bool single_function)
{
	auto &cfg = *function_cfgs.find(entry.self)->second;

	// For each variable which is statically accessed.
	for (auto &accessed_var : handler.accessed_variables_to_block)
	{
		auto &blocks = accessed_var.second;
		auto &var = get<SPIRVariable>(accessed_var.first);
		auto &type = expression_type(accessed_var.first);

		// First check if there are writes to the variable. Later, if there are none, we'll
		// reconsider it as globally accessed LUT.
		if (!var.is_written_to)
		{
			var.is_written_to = handler.complete_write_variables_to_block.count(var.self) != 0 ||
			                    handler.partial_write_variables_to_block.count(var.self) != 0;
		}

		// Only consider function local variables here.
		// If we only have a single function in our CFG, private storage is also fine,
		// since it behaves like a function local variable.
		bool allow_lut = var.storage == StorageClassFunction || (single_function && var.storage == StorageClassPrivate);
		if (!allow_lut)
			continue;

		// We cannot be a phi variable.
		if (var.phi_variable)
			continue;

		// Only consider arrays here.
		if (type.array.empty())
			continue;

		// If the variable has an initializer, make sure it is a constant expression.
		uint32_t static_constant_expression = 0;
		if (var.initializer)
		{
			if (ir.ids[var.initializer].get_type() != TypeConstant)
				continue;
			static_constant_expression = var.initializer;

			// There can be no stores to this variable, we have now proved we have a LUT.
			if (var.is_written_to)
				continue;
		}
		else
		{
			// We can have one, and only one write to the variable, and that write needs to be a constant.

			// No partial writes allowed.
			if (handler.partial_write_variables_to_block.count(var.self) != 0)
				continue;

			auto itr = handler.complete_write_variables_to_block.find(var.self);

			// No writes?
			if (itr == end(handler.complete_write_variables_to_block))
				continue;

			// We write to the variable in more than one block.
			auto &write_blocks = itr->second;
			if (write_blocks.size() != 1)
				continue;

			// The write needs to happen in the dominating block.
			DominatorBuilder builder(cfg);
			for (auto &block : blocks)
				builder.add_block(block);
			uint32_t dominator = builder.get_dominator();

			// The complete write happened in a branch or similar, cannot deduce static expression.
			if (write_blocks.count(dominator) == 0)
				continue;

			// Find the static expression for this variable.
			StaticExpressionAccessHandler static_expression_handler(*this, var.self);
			traverse_all_reachable_opcodes(get<SPIRBlock>(dominator), static_expression_handler);

			// We want one, and exactly one write
			if (static_expression_handler.write_count != 1 || static_expression_handler.static_expression == 0)
				continue;

			// Is it a constant expression?
			if (ir.ids[static_expression_handler.static_expression].get_type() != TypeConstant)
				continue;

			// We found a LUT!
			static_constant_expression = static_expression_handler.static_expression;
		}

		get<SPIRConstant>(static_constant_expression).is_used_as_lut = true;
		var.static_expression = static_constant_expression;
		var.statically_assigned = true;
		var.remapped_variable = true;
	}
}